

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.h
# Opt level: O2

void phaeton::ph_unreachable_internal(char *msg,char *file,uint line)

{
  ostream *poVar1;
  
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,msg);
    std::operator<<(poVar1,"\n");
  }
  std::operator<<((ostream *)&std::cerr,"UNREACHABLE executed");
  poVar1 = std::operator<<((ostream *)&std::cerr," at ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Sema/Sema.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,(uint)file);
  std::operator<<((ostream *)&std::cerr,"!\n");
  abort();
}

Assistant:

PH_ATTRIBUTE_NORETURN static void
ph_unreachable_internal(const char *msg = nullptr, const char *file = nullptr,
                        unsigned line = 0) {
  if (msg)
    std::cerr << msg << "\n";
  std::cerr << "UNREACHABLE executed";
  if (file)
    std::cerr << " at " << file << ":" << line;
  std::cerr << "!\n";
  abort();
}